

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall Assimp::X3DExporter::Export_Node(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  aiVector3D pVector;
  aiVector3D pVector_00;
  aiVector3D pAxis;
  bool bVar1;
  char *__s;
  float fVar2;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  ulong local_2b8;
  size_t idx_node;
  size_t idx_mesh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  aiMetadataEntry *local_268;
  aiMetadataEntry *entry;
  aiString *key;
  size_t idx_prop;
  string local_248;
  allocator<char> local_221;
  string local_220;
  float local_200;
  float fStack_1fc;
  float local_1f8;
  float local_1f0;
  float fStack_1ec;
  float local_1e8;
  allocator<char> local_1e1;
  value_type local_1e0;
  float local_1a0;
  float fStack_19c;
  float local_198;
  float local_190;
  float fStack_18c;
  float local_188;
  allocator<char> local_181;
  value_type local_180;
  aiVector3t<float> local_13c;
  aiVector3t<float> local_130;
  aiVector3t<float> local_120;
  allocator<char> local_111;
  value_type local_110;
  float local_d0;
  undefined1 auStack_cc [4];
  ai_real rotate_angle;
  aiVector3D rotate_axis;
  aiVector3D translate;
  aiVector3D scale;
  anon_class_8_1_8991fb9c Rotation2String;
  anon_class_8_1_8991fb9c Vector2String;
  value_type local_90;
  undefined4 local_50;
  undefined1 local_40 [8];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  bool transform;
  size_t pTabLevel_local;
  aiNode *pNode_local;
  X3DExporter *this_local;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size._7_1_ = 0;
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_40);
  bVar1 = CheckAndExport_Light(this,pNode,pTabLevel);
  if (bVar1) {
    local_50 = 1;
  }
  else {
    if ((pNode->mName).length != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"DEF",(allocator<char> *)((long)&Vector2String.this + 7));
      Vector2String.this._5_1_ = 1;
      __s = aiString::C_Str(&pNode->mName);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90.Value,__s,(allocator<char> *)((long)&Vector2String.this + 6));
      Vector2String.this._5_1_ = 0;
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 *)local_40,&local_90);
      SAttribute::~SAttribute(&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&Vector2String.this + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&Vector2String.this + 7));
    }
    bVar1 = aiMatrix4x4t<float>::IsIdentity(&pNode->mTransformation);
    if (!bVar1) {
      scale._4_8_ = this;
      Rotation2String.this = this;
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&translate.y);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&rotate_axis.y);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_cc);
      attr_list.
      super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ._M_impl._M_node._M_size._7_1_ = 1;
      aiMatrix4x4t<float>::Decompose
                (&pNode->mTransformation,(aiVector3t<float> *)&translate.y,
                 (aiVector3t<float> *)auStack_cc,&local_d0,(aiVector3t<float> *)&rotate_axis.y);
      if (((local_d0 != 0.0) || (NAN(local_d0))) &&
         (fVar2 = aiVector3t<float>::Length((aiVector3t<float> *)auStack_cc), 0.0 < fVar2)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"rotation",&local_111);
        local_120.z = rotate_axis.x;
        local_120.x = (float)auStack_cc;
        local_120.y = rotate_angle;
        local_130.z = rotate_axis.x;
        local_130.x = (float)auStack_cc;
        local_130.y = rotate_angle;
        pAxis.z = rotate_axis.x;
        pAxis.x = (float)auStack_cc;
        pAxis.y = rotate_angle;
        Export_Node(aiNode_const*,unsigned_long)::$_0::operator()[abi_cxx11_
                  (&local_110.Value,&scale.y,pAxis,local_d0);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)local_40,&local_110);
        SAttribute::~SAttribute(&local_110);
        std::allocator<char>::~allocator(&local_111);
      }
      aiVector3t<float>::aiVector3t(&local_13c,1.0,1.0,1.0);
      bVar1 = aiVector3t<float>::Equal((aiVector3t<float> *)&translate.y,&local_13c,1e-06);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"scale",&local_181);
        local_188 = scale.x;
        local_190 = translate.y;
        fStack_18c = translate.z;
        local_198 = scale.x;
        local_1a0 = translate.y;
        fStack_19c = translate.z;
        pVector_00.z = scale.x;
        pVector_00.x = translate.y;
        pVector_00.y = translate.z;
        Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                  (&local_180.Value,&Rotation2String,pVector_00);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)local_40,&local_180);
        SAttribute::~SAttribute(&local_180);
        std::allocator<char>::~allocator(&local_181);
      }
      fVar2 = aiVector3t<float>::Length((aiVector3t<float> *)&rotate_axis.y);
      if (0.0 < fVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"translation",&local_1e1);
        local_1e8 = translate.x;
        local_1f0 = rotate_axis.y;
        fStack_1ec = rotate_axis.z;
        local_1f8 = translate.x;
        local_200 = rotate_axis.y;
        fStack_1fc = rotate_axis.z;
        pVector.z = translate.x;
        pVector.x = rotate_axis.y;
        pVector.y = rotate_axis.z;
        Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                  (&local_1e0.Value,&Rotation2String,pVector);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)local_40,&local_1e0);
        SAttribute::~SAttribute(&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
      }
    }
    if ((attr_list.
         super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
         ._M_impl._M_node._M_size._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"Group",(allocator<char> *)((long)&idx_prop + 7));
      NodeHelper_OpenNode(this,&local_248,pTabLevel,false);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)((long)&idx_prop + 7));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"Transform",&local_221);
      NodeHelper_OpenNode(this,&local_220,pTabLevel,false,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)local_40);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
    }
    if (pNode->mMetaData != (aiMetadata *)0x0) {
      for (key = (aiString *)0x0; key < (aiString *)(ulong)pNode->mMetaData->mNumProperties;
          key = (aiString *)((long)&key->length + 1)) {
        bVar1 = aiMetadata::Get(pNode->mMetaData,(size_t)key,(aiString **)&entry,&local_268);
        if (bVar1) {
          switch(local_268->mType) {
          case AI_BOOL:
            Export_MetadataBoolean
                      (this,(aiString *)entry,(bool)(*local_268->mData & 1),pTabLevel + 1);
            break;
          case AI_INT32:
            Export_MetadataInteger(this,(aiString *)entry,*local_268->mData,pTabLevel + 1);
            break;
          default:
            to_string<aiMetadataType>((string *)&idx_mesh,local_268->mType);
            std::operator+(&local_288,"Unsupported metadata type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &idx_mesh);
            LogError(this,&local_288);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&idx_mesh);
            break;
          case AI_FLOAT:
            Export_MetadataFloat(this,(aiString *)entry,*local_268->mData,pTabLevel + 1);
            break;
          case AI_DOUBLE:
            Export_MetadataDouble(this,(aiString *)entry,*local_268->mData,pTabLevel + 1);
            break;
          case AI_AISTRING:
            Export_MetadataString(this,(aiString *)entry,(aiString *)local_268->mData,pTabLevel + 1)
            ;
          }
        }
      }
    }
    for (idx_node = 0; idx_node < pNode->mNumMeshes; idx_node = idx_node + 1) {
      Export_Mesh(this,(ulong)pNode->mMeshes[idx_node],pTabLevel + 1);
    }
    for (local_2b8 = 0; local_2b8 < pNode->mNumChildren; local_2b8 = local_2b8 + 1) {
      Export_Node(this,pNode->mChildren[local_2b8],pTabLevel + 1);
    }
    if ((attr_list.
         super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
         ._M_impl._M_node._M_size._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"Group",&local_301);
      NodeHelper_CloseNode(this,&local_300,pTabLevel);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"Transform",&local_2d9);
      NodeHelper_CloseNode(this,&local_2d8,pTabLevel);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    local_50 = 0;
  }
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::~list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_40);
  return;
}

Assistant:

void X3DExporter::Export_Node(const aiNode *pNode, const size_t pTabLevel)
{
bool transform = false;
list<SAttribute> attr_list;

	// In Assimp lights is stored in next way: light source store in mScene->mLights and in node tree must present aiNode with name same as
	// light source has. Considering it we must compare every aiNode name with light sources names. Why not to look where ligths is present
	// and save them to fili? Because corresponding aiNode can be already written to file and we can only add information to file not to edit.
	if(CheckAndExport_Light(*pNode, pTabLevel)) return;

	// Check if need DEF.
	if(pNode->mName.length) attr_list.push_back({"DEF", pNode->mName.C_Str()});

	// Check if need <Transformation> node against <Group>.
	if(!pNode->mTransformation.IsIdentity())
	{
		auto Vector2String = [this](const aiVector3D pVector) -> string
		{
			string tstr = to_string(pVector.x) + " " + to_string(pVector.y) + " " + to_string(pVector.z);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		auto Rotation2String = [this](const aiVector3D pAxis, const ai_real pAngle) -> string
		{
			string tstr = to_string(pAxis.x) + " " + to_string(pAxis.y) + " " + to_string(pAxis.z) + " " + to_string(pAngle);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		aiVector3D scale, translate, rotate_axis;
		ai_real rotate_angle;

		transform = true;
		pNode->mTransformation.Decompose(scale, rotate_axis, rotate_angle, translate);
		// Check if values different from default
		if((rotate_angle != 0) && (rotate_axis.Length() > 0))
			attr_list.push_back({"rotation", Rotation2String(rotate_axis, rotate_angle)});

        if(!scale.Equal({1.0,1.0,1.0})) {
            attr_list.push_back({"scale", Vector2String(scale)});
        }
        if(translate.Length() > 0) {
            attr_list.push_back({"translation", Vector2String(translate)});
        }
	}

	// Begin node if need.
	if(transform)
		NodeHelper_OpenNode("Transform", pTabLevel, false, attr_list);
	else
		NodeHelper_OpenNode("Group", pTabLevel);

	// Export metadata
	if(pNode->mMetaData != nullptr)
	{
		for(size_t idx_prop = 0; idx_prop < pNode->mMetaData->mNumProperties; idx_prop++)
		{
			const aiString* key;
			const aiMetadataEntry* entry;

			if(pNode->mMetaData->Get(idx_prop, key, entry))
			{
				switch(entry->mType)
				{
					case AI_BOOL:
						Export_MetadataBoolean(*key, *static_cast<bool*>(entry->mData), pTabLevel + 1);
						break;
					case AI_DOUBLE:
						Export_MetadataDouble(*key, *static_cast<double*>(entry->mData), pTabLevel + 1);
						break;
					case AI_FLOAT:
						Export_MetadataFloat(*key, *static_cast<float*>(entry->mData), pTabLevel + 1);
						break;
					case AI_INT32:
						Export_MetadataInteger(*key, *static_cast<int32_t*>(entry->mData), pTabLevel + 1);
						break;
					case AI_AISTRING:
						Export_MetadataString(*key, *static_cast<aiString*>(entry->mData), pTabLevel + 1);
						break;
					default:
						LogError("Unsupported metadata type: " + to_string(entry->mType));
						break;
				}// switch(entry->mType)
			}
		}
	}// if(pNode->mMetaData != nullptr)

	// Export meshes.
	for(size_t idx_mesh = 0; idx_mesh < pNode->mNumMeshes; idx_mesh++) Export_Mesh(pNode->mMeshes[idx_mesh], pTabLevel + 1);
	// Export children.
	for(size_t idx_node = 0; idx_node < pNode->mNumChildren; idx_node++) Export_Node(pNode->mChildren[idx_node], pTabLevel + 1);

	// End node if need.
	if(transform)
		NodeHelper_CloseNode("Transform", pTabLevel);
	else
		NodeHelper_CloseNode("Group", pTabLevel);
}